

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O3

int Llb_NonlinReachability(Llb_Mnn_t *p)

{
  DdManager *dd;
  Vec_Ptr_t *pVVar1;
  int *pVar2Lev;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  DdNode *pDVar7;
  DdManager *pDVar8;
  void **ppvVar9;
  DdNode *pDVar10;
  Gia_ParLlb_t *pGVar11;
  Abc_Cex_t *pAVar12;
  long lVar13;
  abctime aVar14;
  abctime time;
  abctime time_00;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  Llb_Mnn_t *pLVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  timespec ts;
  timespec local_60;
  uint local_4c;
  double local_48;
  uint local_3c;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar19 = -1;
  }
  else {
    lVar19 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  if (p->pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1b2,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  pGVar11 = p->pPars;
  iVar2 = pGVar11->TimeLimit;
  if ((long)iVar2 == 0) {
    aVar14 = 0;
  }
  else {
    iVar3 = clock_gettime(3,&local_60);
    if (iVar3 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    aVar14 = lVar13 + (long)iVar2 * 1000000;
    pGVar11 = p->pPars;
  }
  pGVar11->TimeTarget = aVar14;
  pDVar8 = p->dd;
  pDVar8->TimeStop = aVar14;
  p->ddG->TimeStop = aVar14;
  dd = p->ddR;
  dd->TimeStop = aVar14;
  if (pDVar8->bFunc != (DdNode *)0x0) {
    __assert_fail("p->dd->bFunc == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1bd,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  pDVar7 = Llb_BddComputeBad(p->pInit,dd,aVar14);
  p->ddR->bFunc = pDVar7;
  if (pDVar7 != (DdNode *)0x0) {
    Cudd_Ref(pDVar7);
    Cudd_Quit(p->dd);
    pDVar8 = Llb_NonlinImageStart
                       (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,1,p->pPars->TimeTarget);
    p->dd = pDVar8;
    if (pDVar8 != (DdManager *)0x0) {
      local_38 = lVar19;
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,pDVar8);
      p->dd->bFunc = pDVar7;
      Cudd_Ref(pDVar7);
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc = pDVar7;
      Cudd_Ref(pDVar7);
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc2 = pDVar7;
      Cudd_Ref(pDVar7);
      if (p->pPars->nIterMax < 1) {
        local_4c = 0xffffffff;
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        do {
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar19 = 1;
          }
          else {
            lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          if (p->pPars->TimeLimit != 0) {
            iVar2 = clock_gettime(3,&local_60);
            if (iVar2 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
            }
            pGVar11 = p->pPars;
            if (lVar13 <= pGVar11->TimeTarget) goto LAB_00842f85;
            if (pGVar11->fSilent == 0) {
              uVar16 = (ulong)(uint)pGVar11->TimeLimit;
              pcVar17 = "Reached timeout (%d seconds) during image computation.\n";
              goto LAB_0084398a;
            }
LAB_00843995:
            uVar15 = uVar15 - 1;
LAB_00843997:
            pGVar11->iFrame = uVar15;
LAB_0084399a:
            Llb_NonlinImageQuit();
            return -1;
          }
LAB_00842f85:
          pDVar7 = Extra_TransferPermute(p->dd,p->ddR,p->dd->bFunc,p->vCs2Glo->pArray);
          if (pDVar7 == (DdNode *)0x0) {
            pGVar11 = p->pPars;
            if (pGVar11->fSilent == 0) {
              uVar16 = (ulong)(uint)pGVar11->TimeLimit;
              pcVar17 = "Reached timeout (%d seconds) during ring transfer.\n";
LAB_0084398a:
              printf(pcVar17,uVar16);
              pGVar11 = p->pPars;
            }
            goto LAB_00843995;
          }
          local_48 = (double)lVar19;
          Cudd_Ref(pDVar7);
          pVVar1 = p->vRings;
          uVar4 = pVVar1->nSize;
          if (uVar4 == pVVar1->nCap) {
            if ((int)uVar4 < 0x10) {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar1->pArray,0x80);
              }
              pVVar1->pArray = ppvVar9;
              pVVar1->nCap = 0x10;
            }
            else {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar4 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar1->pArray,(ulong)uVar4 << 4);
              }
              pVVar1->pArray = ppvVar9;
              pVVar1->nCap = uVar4 * 2;
            }
          }
          else {
            ppvVar9 = pVVar1->pArray;
          }
          iVar2 = pVVar1->nSize;
          pVVar1->nSize = iVar2 + 1;
          ppvVar9[iVar2] = pDVar7;
          if (p->pPars->fSkipOutCheck == 0) {
            pDVar8 = p->ddR;
            iVar2 = Cudd_bddLeq(pDVar8,pDVar7,(DdNode *)((ulong)pDVar8->bFunc ^ 1));
            iVar3 = (int)pDVar8;
            if (iVar2 == 0) {
              if (p->pInit->pSeqModel != (Abc_Cex_t *)0x0) {
                __assert_fail("p->pInit->pSeqModel == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                              ,0x1f5,"int Llb_NonlinReachability(Llb_Mnn_t *)");
              }
              pGVar11 = p->pPars;
              if (pGVar11->fBackward == 0) {
                pLVar18 = p;
                pAVar12 = Llb_NonlinDeriveCex(p);
                iVar3 = (int)pLVar18;
                p->pInit->pSeqModel = pAVar12;
                pGVar11 = p->pPars;
              }
              else {
                pAVar12 = (Abc_Cex_t *)0x0;
              }
              if (pGVar11->fSilent == 0) {
                if (pGVar11->fBackward == 0) {
                  Abc_Print(iVar3,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                            (ulong)(uint)pAVar12->iPo,uVar15);
                }
                else {
                  Abc_Print(iVar3,
                            "Output ??? was asserted in frame %d (counter-example is not produced).  "
                            ,uVar15);
                }
                aVar14 = Abc_Clock();
                Abc_PrintTime(0xa0ce9c,(char *)(aVar14 - local_38),time_00);
                pGVar11 = p->pPars;
              }
              pGVar11->iFrame = uVar15 - 1;
              Llb_NonlinImageQuit();
              return 0;
            }
          }
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar19 = 1;
          }
          else {
            lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          local_3c = Cudd_DagSize(p->dd->bFunc);
          pDVar7 = Llb_NonlinImageCompute(p->dd->bFunc,p->pPars->fReorder,0,1,p->pOrderL);
          if (pDVar7 == (DdNode *)0x0) {
            pGVar11 = p->pPars;
            if (pGVar11->fSilent == 0) {
              printf("Reached timeout (%d seconds) during image computation in quantification.\n",
                     (ulong)(uint)pGVar11->TimeLimit);
              pGVar11 = p->pPars;
            }
            pGVar11->iFrame = uVar15 - 1;
            goto LAB_0084399a;
          }
          Cudd_Ref(pDVar7);
          local_4c = Cudd_DagSize(pDVar7);
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeImage = p->timeImage + lVar13 + lVar19;
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar19 = 1;
          }
          else {
            lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          Cudd_RecursiveDeref(p->ddG,p->ddG->bFunc2);
          pDVar10 = Extra_TransferPermute(p->dd,p->ddG,pDVar7,p->vNs2Glo->pArray);
          p->ddG->bFunc2 = pDVar10;
          if (pDVar10 == (DdNode *)0x0) {
            pGVar11 = p->pPars;
            if (pGVar11->fSilent == 0) {
              printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                     (ulong)(uint)pGVar11->TimeLimit);
              pGVar11 = p->pPars;
            }
            pGVar11->iFrame = uVar15 - 1;
            pDVar8 = p->dd;
LAB_0084390d:
            Cudd_RecursiveDeref(pDVar8,pDVar7);
            goto LAB_0084399a;
          }
          Cudd_Ref(pDVar10);
          Cudd_RecursiveDeref(p->dd,pDVar7);
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeTran1 = p->timeTran1 + lVar13 + lVar19;
          pDVar8 = p->dd;
          pVar2Lev = p->pOrderL2;
          uVar4 = Llb_NonlinCompPerms(pDVar8,pVar2Lev);
          memcpy(pVar2Lev,pDVar8->perm,(long)pDVar8->size << 2);
          lVar19 = Cudd_ReadReorderingTime(p->dd);
          p->timeReo = p->timeReo + lVar19;
          iVar2 = Cudd_ReadReorderings(p->dd);
          p->ddLocReos = p->ddLocReos + iVar2;
          iVar2 = Cudd_ReadGarbageCollections(p->dd);
          p->ddLocGrbs = p->ddLocGrbs + iVar2;
          Llb_NonlinImageQuit();
          pDVar8 = Llb_NonlinImageStart
                             (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,0,
                              p->pPars->TimeTarget);
          p->dd = pDVar8;
          if (pDVar8 == (DdManager *)0x0) {
            pGVar11 = p->pPars;
            if (pGVar11->fSilent == 0) {
              printf("Reached timeout (%d seconds) during constructing the bad states.\n",
                     (ulong)(uint)pGVar11->TimeLimit);
              pGVar11 = p->pPars;
            }
            iVar2 = uVar15 - 1;
            goto LAB_0084393c;
          }
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar19 = 1;
          }
          else {
            lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          pDVar8 = p->ddG;
          pDVar7 = pDVar8->bFunc2;
          pDVar10 = Cudd_bddAnd(pDVar8,pDVar7,(DdNode *)((ulong)pDVar8->bFunc ^ 1));
          pDVar8 = p->ddG;
          pDVar8->bFunc2 = pDVar10;
          if (pDVar10 == (DdNode *)0x0) {
LAB_00843863:
            pGVar11 = p->pPars;
            if (pGVar11->fSilent == 0) {
              printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                     (ulong)(uint)pGVar11->TimeLimit);
              pGVar11 = p->pPars;
              pDVar8 = p->ddG;
            }
            pGVar11->iFrame = uVar15 - 1;
            goto LAB_0084390d;
          }
          Cudd_Ref(pDVar10);
          Cudd_RecursiveDeref(p->ddG,pDVar7);
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeGloba = p->timeGloba + lVar13 + lVar19;
          if (*(int *)((ulong)p->ddG->bFunc2 & 0xfffffffffffffffe) == 0x7fffffff) break;
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar19 = 1;
          }
          else {
            lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          pDVar8 = p->ddG;
          pDVar7 = pDVar8->bFunc;
          pDVar10 = Cudd_bddOr(pDVar8,pDVar7,pDVar8->bFunc2);
          pDVar8 = p->ddG;
          pDVar8->bFunc = pDVar10;
          if (pDVar10 == (DdNode *)0x0) goto LAB_00843863;
          Cudd_Ref(pDVar10);
          Cudd_RecursiveDeref(p->ddG,pDVar7);
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeGloba = p->timeGloba + lVar13 + lVar19;
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar19 = 1;
          }
          else {
            lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          pDVar7 = Extra_TransferPermute(p->ddG,p->dd,p->ddG->bFunc2,p->vGlo2Cs->pArray);
          p->dd->bFunc = pDVar7;
          if (pDVar7 == (DdNode *)0x0) {
            pGVar11 = p->pPars;
            if (pGVar11->fSilent == 0) {
              uVar16 = (ulong)(uint)pGVar11->TimeLimit;
              pcVar17 = "Reached timeout (%d seconds) during image computation in transfer 2.\n";
              goto LAB_0084398a;
            }
            goto LAB_00843995;
          }
          Cudd_Ref(pDVar7);
          iVar2 = clock_gettime(3,&local_60);
          if (iVar2 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeTran2 = p->timeTran2 + lVar13 + lVar19;
          pGVar11 = p->pPars;
          if (pGVar11->fVerbose != 0) {
            printf("I =%3d : ",(ulong)uVar15);
            printf("Fr =%7d ",(ulong)local_3c);
            printf("Im =%7d  ",(ulong)local_4c);
            printf("(%4d %4d)  ",(ulong)(uint)p->ddLocReos,(ulong)(uint)p->ddLocGrbs);
            uVar5 = Cudd_DagSize(p->ddG->bFunc);
            printf("Rea =%6d  ",(ulong)uVar5);
            uVar5 = Cudd_ReadReorderings(p->ddG);
            uVar6 = Cudd_ReadGarbageCollections(p->ddG);
            printf("(%4d %4d)  ",(ulong)uVar5,(ulong)uVar6);
            printf("S =%4d ",(ulong)(uint)nSuppMax);
            printf("cL =%5d ",(ulong)uVar4);
            uVar4 = Llb_NonlinCompPerms(p->ddG,p->pOrderG);
            printf("cG =%5d ",(ulong)uVar4);
            iVar3 = 3;
            iVar2 = clock_gettime(3,&local_60);
            if (iVar2 < 0) {
              lVar19 = -1;
            }
            else {
              lVar19 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
            }
            lVar19 = lVar19 + (long)local_48;
            Abc_Print(iVar3,"%s =","T");
            Abc_Print(iVar3,"%9.2f sec\n",(double)lVar19 / 1000000.0);
            memcpy(p->pOrderG,p->ddG->perm,(long)p->ddG->size << 2);
            pGVar11 = p->pPars;
          }
          if (uVar15 == pGVar11->nIterMax - 1U) {
            if (pGVar11->fSilent == 0) {
              printf("Reached limit on the number of timeframes (%d).\n");
              pGVar11 = p->pPars;
            }
            goto LAB_00843997;
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < pGVar11->nIterMax);
      }
      Llb_NonlinImageQuit();
      pGVar11 = p->pPars;
      if (pGVar11->fVerbose != 0) {
        dVar20 = Cudd_CountMinterm(p->ddG,p->ddG->bFunc,p->pAig->nRegs);
        if ((int)uVar15 < p->pPars->nIterMax) {
          pcVar17 = "Reachability analysis completed after %d frames.\n";
          if (p->pPars->nBddMax < (int)local_4c) {
            pcVar17 = "Reachability analysis is stopped after %d frames.\n";
          }
        }
        else {
          pcVar17 = "Reachability analysis is stopped after %d frames.\n";
        }
        printf(pcVar17,(ulong)uVar15);
        local_48 = dVar20 * 100.0;
        dVar21 = ldexp(1.0,p->pAig->nRegs);
        printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar20,local_48 / dVar21);
        fflush(_stdout);
      }
      iVar2 = pGVar11->nIterMax;
      if (((int)uVar15 < iVar2) && ((int)local_4c <= pGVar11->nBddMax)) {
        if (pGVar11->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar15);
          pGVar11 = p->pPars;
        }
        pGVar11->iFrame = uVar15 - 1;
        aVar14 = Abc_Clock();
        Abc_PrintTime(0xa0ce9c,(char *)(aVar14 - local_38),time);
        return 1;
      }
      if (pGVar11->fSilent == 0) {
        printf("Verified only for states reachable in %d frames.  ",(ulong)uVar15);
        pGVar11 = p->pPars;
        iVar2 = pGVar11->nIterMax;
      }
LAB_0084393c:
      pGVar11->iFrame = iVar2;
      return -1;
    }
  }
  pGVar11 = p->pPars;
  if (pGVar11->fSilent == 0) {
    printf("Reached timeout (%d seconds) during constructing the bad states.\n",
           (ulong)(uint)pGVar11->TimeLimit);
    pGVar11 = p->pPars;
  }
  pGVar11->iFrame = -1;
  return -1;
}

Assistant:

int Llb_NonlinReachability( Llb_Mnn_t * p )
{ 
    DdNode * bTemp, * bNext;
    int nIters, nBddSize0, nBddSize = -1, NumCmp;//, Limit = p->pPars->nBddMax;
    abctime clk2, clk3, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // set reordering hooks
    assert( p->dd->bFunc == NULL );
//    p->dd->bFunc = (DdNode *)p->pAig;
//    Cudd_AddHook( p->dd, Llb_NonlinReoHook, CUDD_POST_REORDERING_HOOK );

    // create bad state in the ring manager
    p->ddR->bFunc  = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );          
    if ( p->ddR->bFunc == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    Cudd_Ref( p->ddR->bFunc );
    // compute the starting set of states
    Cudd_Quit( p->dd );
    p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 1, p->pPars->TimeTarget );
    if ( p->dd == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    p->dd->bFunc   = Llb_NonlinComputeInitState( p->pAig, p->dd );   Cudd_Ref( p->dd->bFunc );   // current
    p->ddG->bFunc  = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc );  // reached
    p->ddG->bFunc2 = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc2 ); // frontier 
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        clk2 = Abc_Clock();
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, p->dd->bFunc, Vec_IntArray(p->vCs2Glo) );
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during ring transfer.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pInit->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pInit->pSeqModel = Llb_NonlinDeriveCex( p ); 
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pInit->pSeqModel->iPo, nIters );
                else
                    Abc_Print( 1, "Output ??? was asserted in frame %d (counter-example is not produced).  ", nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return 0;
        }

        // compute the next states
        clk3 = Abc_Clock();
        nBddSize0 = Cudd_DagSize( p->dd->bFunc );
        bNext = Llb_NonlinImageCompute( p->dd->bFunc, p->pPars->fReorder, 0, 1, p->pOrderL ); // consumes ref   
//        bNext = Llb_NonlinImage( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->dd, bCurrent, 
//            p->pPars->fReorder, p->pPars->fVeryVerbose, NULL, ABC_INFINITY, p->pPars->TimeTarget );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bNext );
        nBddSize = Cudd_DagSize( bNext );
        p->timeImage += Abc_Clock() - clk3;


        // transfer to the state manager
        clk3 = Abc_Clock();
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
        p->ddG->bFunc2 = Extra_TransferPermute( p->dd, p->ddG, bNext, Vec_IntArray(p->vNs2Glo) );    
//        p->ddG->bFunc2 = Extra_bddAndPermute( p->ddG, Cudd_Not(p->ddG->bFunc), p->dd, bNext, Vec_IntArray(p->vNs2Glo) );    
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bNext );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->dd, bNext );
        p->timeTran1 += Abc_Clock() - clk3;

        // save permutation
        NumCmp = Llb_NonlinCompPerms( p->dd, p->pOrderL2 );
        // save order before image computation
        memcpy( p->pOrderL2, p->dd->perm, sizeof(int) * p->dd->size );
        // update the image computation manager
        p->timeReo   += Cudd_ReadReorderingTime(p->dd);
        p->ddLocReos += Cudd_ReadReorderings(p->dd);
        p->ddLocGrbs += Cudd_ReadGarbageCollections(p->dd);
        Llb_NonlinImageQuit();
        p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 0, p->pPars->TimeTarget );
        if ( p->dd == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        //Extra_TestAndPerm( p->ddG, Cudd_Not(p->ddG->bFunc), p->ddG->bFunc2 );    

        // derive new states
        clk3 = Abc_Clock();
        p->ddG->bFunc2 = Cudd_bddAnd( p->ddG, bTemp = p->ddG->bFunc2, Cudd_Not(p->ddG->bFunc) );     
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        if ( Cudd_IsConstant(p->ddG->bFunc2) )
            break;
        // add to the reached set
        clk3 = Abc_Clock();
        p->ddG->bFunc = Cudd_bddOr( p->ddG, bTemp = p->ddG->bFunc, p->ddG->bFunc2 );                 
        if ( p->ddG->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        // reset permutation
//        RetValue = Cudd_CheckZeroRef( dd );
//        assert( RetValue == 0 );
//        Cudd_ShuffleHeap( dd, pOrderG );

        // move new states to the working manager
        clk3 = Abc_Clock();
        p->dd->bFunc = Extra_TransferPermute( p->ddG, p->dd, p->ddG->bFunc2, Vec_IntArray(p->vGlo2Cs) ); 
        if ( p->dd->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->dd->bFunc );
        p->timeTran2 += Abc_Clock() - clk3;

        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%3d : ",   nIters );
            printf( "Fr =%7d ",    nBddSize0 );
            printf( "Im =%7d  ",   nBddSize );
            printf( "(%4d %4d)  ", p->ddLocReos, p->ddLocGrbs );
            printf( "Rea =%6d  ",  Cudd_DagSize(p->ddG->bFunc) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            printf( "S =%4d ",     nSuppMax );
            printf( "cL =%5d ",    NumCmp );
            printf( "cG =%5d ",    Llb_NonlinCompPerms( p->ddG, p->pOrderG ) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clk2 );
            memcpy( p->pOrderG, p->ddG->perm, sizeof(int) * p->ddG->size );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(ddG, bReached, Saig_ManRegNum(pAig) );
//            Extra_bddPrint( ddG, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            Llb_NonlinImageQuit();
            return -1;
        }
    }
    Llb_NonlinImageQuit();
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, p->ddG->bFunc, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    p->pPars->iFrame = nIters - 1;
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 1; // unreachable
}